

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_memory.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBMemoryInit(ClientContext *context,TableFunctionInitInput *input)

{
  pointer pMVar1;
  BufferManager *pBVar2;
  pointer pDVar3;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::DuckDBMemoryData_*,_false> local_30;
  pointer local_28;
  pointer pMStack_20;
  pointer local_18;
  
  local_30._M_head_impl = (DuckDBMemoryData *)operator_new(0x28);
  *(undefined ***)
   &(((element_type *)local_30._M_head_impl)->super_enable_shared_from_this<duckdb::ClientContext>).
    __weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__DuckDBMemoryData_019b36f8;
  (((element_type *)local_30._M_head_impl)->super_enable_shared_from_this<duckdb::ClientContext>).
  __weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((element_type *)local_30._M_head_impl)->db).internal.
  super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  (((element_type *)local_30._M_head_impl)->db).internal.
  super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&((element_type *)local_30._M_head_impl)->interrupted = 0;
  pBVar2 = BufferManager::GetBufferManager((ClientContext *)input);
  (*pBVar2->_vptr_BufferManager[0x17])(&local_28,pBVar2);
  pDVar3 = unique_ptr<duckdb::DuckDBMemoryData,_std::default_delete<duckdb::DuckDBMemoryData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBMemoryData,_std::default_delete<duckdb::DuckDBMemoryData>,_true>
                         *)&local_30);
  pMVar1 = (pDVar3->entries).
           super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>.
           super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pDVar3->entries).
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>.
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_start = local_28;
  (pDVar3->entries).
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>.
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_finish = pMStack_20;
  (pDVar3->entries).
  super_vector<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>.
  super__Vector_base<duckdb::MemoryInformation,_std::allocator<duckdb::MemoryInformation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_18;
  local_28 = (pointer)0x0;
  pMStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  if (pMVar1 != (pointer)0x0) {
    operator_delete(pMVar1);
  }
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBMemoryInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBMemoryData>();
	result->entries = BufferManager::GetBufferManager(context).GetMemoryUsageInfo();
	return std::move(result);
}